

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O3

bool __thiscall Ruleset::isSameType(Ruleset *this,Card *c1,Card *c2)

{
  uint uVar1;
  Suit SVar2;
  Suit SVar3;
  iterator __begin1;
  pointer ppRVar4;
  iterator __end1;
  pointer ppRVar5;
  
  ppRVar4 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar4 != ppRVar5) {
    uVar1 = 0;
    do {
      uVar1 = (**(*ppRVar4)->_vptr_Rule)(*ppRVar4,(ulong)(uVar1 & 1),c1);
      ppRVar4 = ppRVar4 + 1;
    } while (ppRVar4 != ppRVar5);
    ppRVar4 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((char)uVar1 != '\0') {
      if (ppRVar4 == ppRVar5) goto LAB_00106fd0;
      uVar1 = 0;
      do {
        uVar1 = (**(*ppRVar4)->_vptr_Rule)(*ppRVar4,(ulong)(uVar1 & 1),c2);
        ppRVar4 = ppRVar4 + 1;
      } while (ppRVar4 != ppRVar5);
      if ((char)uVar1 != '\0') {
        return true;
      }
      ppRVar4 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (ppRVar4 != ppRVar5) {
      uVar1 = 0;
      do {
        uVar1 = (**(*ppRVar4)->_vptr_Rule)(*ppRVar4,(ulong)(uVar1 & 1),c1);
        ppRVar4 = ppRVar4 + 1;
      } while (ppRVar4 != ppRVar5);
      if ((char)uVar1 != '\0') {
        return false;
      }
      ppRVar4 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppRVar5 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (ppRVar4 != ppRVar5) {
      uVar1 = 0;
      do {
        uVar1 = (**(*ppRVar4)->_vptr_Rule)(*ppRVar4,(ulong)(uVar1 & 1),c2);
        ppRVar4 = ppRVar4 + 1;
      } while (ppRVar4 != ppRVar5);
      if ((char)uVar1 != '\0') {
        return false;
      }
    }
  }
LAB_00106fd0:
  SVar2 = Card::suit(c1);
  SVar3 = Card::suit(c2);
  return SVar2 == SVar3;
}

Assistant:

bool Ruleset::isSameType(const Card &c1, const Card &c2) {
    if (isTrump(c1) && isTrump(c2)) return true;
    else {
        if (isTrump(c1) || isTrump(c2)) return false;
        return c1.suit() == c2.suit();
    }
}